

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcd.cpp
# Opt level: O2

void __thiscall GPIO::HitachiLCDBase::init_display(HitachiLCDBase *this)

{
  int_command_nibble(this,'\x03');
  int_command_nibble(this,'\x03');
  int_command_nibble(this,'\x03');
  int_command_nibble(this,'\x02');
  int_command(this,'\x06');
  int_command(this,'\x14');
  int_command(this,'\f');
  int_clear(this);
  return;
}

Assistant:

void HitachiLCDBase::init_display()
{
    unsigned char func = LCD_FUNC | LCD_FUNC_DL;

    // set 4-bit 1-line mode 3 times

    int_command_nibble(func >> 4);
    int_command_nibble(func >> 4);
    int_command_nibble(func >> 4);

    // and switch to full 4-bit mode

    func = LCD_FUNC;
    int_command_nibble(func >> 4);

    int_command(LCD_ENTRY   | LCD_ENTRY_ID);
    int_command(LCD_CDSHIFT | LCD_CDSHIFT_RL);

    // and set display to init configuration

    int_display(true, false, false);
    int_clear();
}